

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_tile_info(AV1_COMMON *cm,aom_write_bit_buffer *saved_wb,aom_write_bit_buffer *wb)

{
  undefined8 *in_RDX;
  aom_write_bit_buffer *in_RSI;
  long in_RDI;
  aom_write_bit_buffer *in_stack_00000028;
  AV1_COMMON *in_stack_00000030;
  
  write_tile_info_max_tile(in_stack_00000030,in_stack_00000028);
  in_RSI->bit_buffer = (uint8_t *)*in_RDX;
  *(undefined8 *)&in_RSI->bit_offset = in_RDX[1];
  if (1 < *(int *)(in_RDI + 0x60a4) * *(int *)(in_RDI + 0x60a0)) {
    aom_wb_write_literal(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX);
    aom_wb_write_literal(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX);
  }
  return;
}

Assistant:

static inline void write_tile_info(const AV1_COMMON *const cm,
                                   struct aom_write_bit_buffer *saved_wb,
                                   struct aom_write_bit_buffer *wb) {
  write_tile_info_max_tile(cm, wb);

  *saved_wb = *wb;
  if (cm->tiles.rows * cm->tiles.cols > 1) {
    // tile id used for cdf update
    aom_wb_write_literal(wb, 0, cm->tiles.log2_cols + cm->tiles.log2_rows);
    // Number of bytes in tile size - 1
    aom_wb_write_literal(wb, 3, 2);
  }
}